

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_eng.c
# Opt level: O0

int populate_gost_engine(ENGINE *e)

{
  int iVar1;
  ENGINE *in_RDI;
  gost_meth_minfo *minfo;
  EVP_PKEY_ASN1_METHOD **in_stack_00000008;
  int ret;
  gost_meth_minfo *pmeth;
  int in_stack_fffffffffffffff0;
  int local_c;
  
  local_c = 0;
  if (in_RDI != (ENGINE *)0x0) {
    iVar1 = ENGINE_set_id(in_RDI,engine_gost_id);
    if (iVar1 == 0) {
      fprintf(_stderr,"ENGINE_set_id failed\n");
    }
    else {
      iVar1 = ENGINE_set_name(in_RDI,engine_gost_name);
      if (iVar1 == 0) {
        fprintf(_stderr,"ENGINE_set_name failed\n");
      }
      else {
        iVar1 = create_NIDs();
        if (iVar1 == 0) {
          fprintf(_stderr,"NID creation failed\n");
        }
        else {
          iVar1 = ENGINE_set_digests(in_RDI,gost_digests);
          if (iVar1 == 0) {
            fprintf(_stderr,"ENGINE_set_digests failed\n");
          }
          else {
            iVar1 = ENGINE_set_ciphers(in_RDI,gost_ciphers);
            if (iVar1 == 0) {
              fprintf(_stderr,"ENGINE_set_ciphers failed\n");
            }
            else {
              iVar1 = ENGINE_set_pkey_meths(in_RDI,gost_pkey_meths);
              if (iVar1 == 0) {
                fprintf(_stderr,"ENGINE_set_pkey_meths failed\n");
              }
              else {
                iVar1 = ENGINE_set_pkey_asn1_meths(in_RDI,gost_pkey_asn1_meths);
                if (iVar1 == 0) {
                  fprintf(_stderr,"ENGINE_set_pkey_asn1_meths failed\n");
                }
                else {
                  iVar1 = ENGINE_set_cmd_defns(in_RDI,(ENGINE_CMD_DEFN *)gost_cmds);
                  if (iVar1 == 0) {
                    fprintf(_stderr,"ENGINE_set_cmd_defns failed\n");
                  }
                  else {
                    iVar1 = ENGINE_set_ctrl_function(in_RDI,gost_control_func);
                    if (iVar1 == 0) {
                      fprintf(_stderr,"ENGINE_set_ctrl_func failed\n");
                    }
                    else {
                      iVar1 = ENGINE_set_destroy_function(in_RDI,gost_engine_destroy);
                      if (((iVar1 != 0) &&
                          (iVar1 = ENGINE_set_init_function(in_RDI,gost_engine_init), iVar1 != 0))
                         && (iVar1 = ENGINE_set_finish_function(in_RDI,gost_engine_finish),
                            iVar1 != 0)) {
                        for (pmeth = gost_meth_array; pmeth->nid != 0; pmeth = pmeth + 1) {
                          if (pmeth->nid != 0x497) {
                            iVar1 = register_ameth_gost((int)e,in_stack_00000008,(char *)minfo,
                                                        (char *)in_RDI);
                            if (iVar1 == 0) {
                              return 0;
                            }
                            iVar1 = register_pmeth_gost(in_stack_fffffffffffffff0,
                                                        (EVP_PKEY_METHOD **)pmeth,0);
                            if (iVar1 == 0) {
                              return 0;
                            }
                          }
                        }
                        local_c = 1;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return local_c;
}

Assistant:

int populate_gost_engine(ENGINE* e) {
    int ret = 0;

    if (e == NULL)
        goto end;
    if (!ENGINE_set_id(e, engine_gost_id)) {
        fprintf(stderr, "ENGINE_set_id failed\n");
        goto end;
    }
    if (!ENGINE_set_name(e, engine_gost_name)) {
        fprintf(stderr, "ENGINE_set_name failed\n");
        goto end;
    }
    if (!create_NIDs()) {
        fprintf(stderr, "NID creation failed\n");
        goto end;
    }
    if (!ENGINE_set_digests(e, gost_digests)) {
        fprintf(stderr, "ENGINE_set_digests failed\n");
        goto end;
    }
    if (!ENGINE_set_ciphers(e, gost_ciphers)) {
        fprintf(stderr, "ENGINE_set_ciphers failed\n");
        goto end;
    }
    if (!ENGINE_set_pkey_meths(e, gost_pkey_meths)) {
        fprintf(stderr, "ENGINE_set_pkey_meths failed\n");
        goto end;
    }
    if (!ENGINE_set_pkey_asn1_meths(e, gost_pkey_asn1_meths)) {
        fprintf(stderr, "ENGINE_set_pkey_asn1_meths failed\n");
        goto end;
    }
    /* Control function and commands */
    if (!ENGINE_set_cmd_defns(e, gost_cmds)) {
        fprintf(stderr, "ENGINE_set_cmd_defns failed\n");
        goto end;
    }
    if (!ENGINE_set_ctrl_function(e, gost_control_func)) {
        fprintf(stderr, "ENGINE_set_ctrl_func failed\n");
        goto end;
    }
    if (!ENGINE_set_destroy_function(e, gost_engine_destroy)
        || !ENGINE_set_init_function(e, gost_engine_init)
        || !ENGINE_set_finish_function(e, gost_engine_finish)) {
        goto end;
    }

    /*
     * "register" in "register_ameth_gost" and "register_pmeth_gost" is
     * not registering in an ENGINE sense, where things are hooked into
     * OpenSSL's library.  "register_ameth_gost" and "register_pmeth_gost"
     * merely allocate and populate the method structures of this engine.
     */
    struct gost_meth_minfo *minfo = gost_meth_array;
    for (; minfo->nid; minfo++) {

        /* This skip looks temporary. */
        if (minfo->nid == NID_id_tc26_cipher_gostr3412_2015_magma_ctracpkm_omac)
            continue;

        if (!register_ameth_gost(minfo->nid, minfo->ameth, minfo->pemstr,
                minfo->info))
            goto end;
        if (!register_pmeth_gost(minfo->nid, minfo->pmeth, 0))
            goto end;
    }

    ret = 1;
  end:
    return ret;
}